

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_ModelSet_clear(HTS_ModelSet *ms)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  free(ms->hts_voice_version);
  free(ms->stream_type);
  free(ms->fullcontext_format);
  free(ms->fullcontext_version);
  if (ms->gv_off_context != (HTS_Question *)0x0) {
    HTS_Question_clear(ms->gv_off_context);
    free(ms->gv_off_context);
  }
  if (ms->option != (char **)0x0) {
    for (uVar2 = 0; uVar2 < ms->num_streams; uVar2 = uVar2 + 1) {
      free(ms->option[uVar2]);
    }
    free(ms->option);
  }
  if (ms->duration != (HTS_Model *)0x0) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < ms->num_voices; uVar2 = uVar2 + 1) {
      HTS_Model_clear((HTS_Model *)((long)&ms->duration->vector_length + lVar3));
      lVar3 = lVar3 + 0x40;
    }
    free(ms->duration);
  }
  if (ms->window != (HTS_Window *)0x0) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < ms->num_streams; uVar2 = uVar2 + 1) {
      HTS_Window_clear((HTS_Window *)((long)&ms->window->size + lVar3));
      lVar3 = lVar3 + 0x28;
    }
    free(ms->window);
  }
  if (ms->stream != (HTS_Model **)0x0) {
    for (uVar2 = 0; uVar2 < ms->num_voices; uVar2 = uVar2 + 1) {
      lVar3 = 0;
      for (uVar1 = 0; uVar1 < ms->num_streams; uVar1 = uVar1 + 1) {
        HTS_Model_clear((HTS_Model *)((long)&ms->stream[uVar2]->vector_length + lVar3));
        lVar3 = lVar3 + 0x40;
      }
      free(ms->stream[uVar2]);
    }
    HTS_free(ms->stream);
  }
  if (ms->gv != (HTS_Model **)0x0) {
    for (uVar2 = 0; uVar2 < ms->num_voices; uVar2 = uVar2 + 1) {
      lVar3 = 0;
      for (uVar1 = 0; uVar1 < ms->num_streams; uVar1 = uVar1 + 1) {
        HTS_Model_clear((HTS_Model *)((long)&ms->gv[uVar2]->vector_length + lVar3));
        lVar3 = lVar3 + 0x40;
      }
      free(ms->gv[uVar2]);
    }
    free(ms->gv);
  }
  ms->window = (HTS_Window *)0x0;
  ms->stream = (HTS_Model **)0x0;
  ms->option = (char **)0x0;
  ms->duration = (HTS_Model *)0x0;
  ms->fullcontext_version = (char *)0x0;
  ms->gv_off_context = (HTS_Question *)0x0;
  ms->stream_type = (char *)0x0;
  ms->fullcontext_format = (char *)0x0;
  ms->num_states = 0;
  ms->num_streams = 0;
  ms->frame_period = 0;
  ms->num_voices = 0;
  ms->hts_voice_version = (char *)0x0;
  ms->sampling_frequency = 0;
  ms->gv = (HTS_Model **)0x0;
  return;
}

Assistant:

void HTS_ModelSet_clear(HTS_ModelSet * ms)
{
   size_t i, j;

   if (ms->hts_voice_version != NULL)
      free(ms->hts_voice_version);
   if (ms->stream_type != NULL)
      free(ms->stream_type);
   if (ms->fullcontext_format != NULL)
      free(ms->fullcontext_format);
   if (ms->fullcontext_version != NULL)
      free(ms->fullcontext_version);
   if (ms->gv_off_context != NULL) {
      HTS_Question_clear(ms->gv_off_context);
      free(ms->gv_off_context);
   }
   if (ms->option != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         if (ms->option[i] != NULL)
            free(ms->option[i]);
      free(ms->option);
   }

   if (ms->duration != NULL) {
      for (i = 0; i < ms->num_voices; i++)
         HTS_Model_clear(&ms->duration[i]);
      free(ms->duration);
   }
   if (ms->window != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         HTS_Window_clear(&ms->window[i]);
      free(ms->window);
   }
   if (ms->stream != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->stream[i][j]);
         free(ms->stream[i]);
      }
      HTS_free(ms->stream);
   }
   if (ms->gv != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->gv[i][j]);
         free(ms->gv[i]);
      }
      free(ms->gv);
   }
   HTS_ModelSet_initialize(ms);
}